

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

void unparsedEntityDeclDebug
               (void *ctx,xmlChar *name,xmlChar *publicId,xmlChar *systemId,xmlChar *notationName)

{
  char *pcVar1;
  
  pcVar1 = "(null)";
  if (publicId == (xmlChar *)0x0) {
    publicId = (xmlChar *)"(null)";
  }
  if (systemId == (xmlChar *)0x0) {
    systemId = (xmlChar *)"(null)";
  }
  if (notationName != (xmlChar *)0x0) {
    pcVar1 = (char *)notationName;
  }
  callbacks = callbacks + 1;
  fprintf((FILE *)SAXdebug,"SAX.unparsedEntityDecl(%s, %s, %s, %s)\n",name,publicId,systemId,pcVar1)
  ;
  return;
}

Assistant:

static void
unparsedEntityDeclDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *name,
		   const xmlChar *publicId, const xmlChar *systemId,
		   const xmlChar *notationName)
{
const xmlChar *nullstr = BAD_CAST "(null)";

    if (publicId == NULL)
        publicId = nullstr;
    if (systemId == NULL)
        systemId = nullstr;
    if (notationName == NULL)
        notationName = nullstr;
    callbacks++;
    if (quiet)
	return;
    fprintf(SAXdebug, "SAX.unparsedEntityDecl(%s, %s, %s, %s)\n",
            (char *) name, (char *) publicId, (char *) systemId,
	    (char *) notationName);
}